

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  undefined8 uVar1;
  bool bVar2;
  Which WVar3;
  uint uVar4;
  StructSchema SVar5;
  InterfaceSchema other_00;
  uint uVar6;
  Fault f;
  ListSchema elementType;
  Reader local_c0;
  StructBuilder local_78;
  Schema local_50;
  StructBuilder local_48;
  
  WVar3 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar3 = (this->schema).elementType.baseType;
  }
  if (WVar3 < TEXT) {
switchD_001756a1_caseD_f:
    Orphan<capnp::DynamicValue>::getReader(&local_c0,orphan);
    set(this,index,&local_c0);
    uVar1 = local_c0.field_1.structValue.reader.segment;
    if ((local_c0.type == CAPABILITY) && (local_c0.field_1._8_8_ != (SegmentReader *)0x0)) {
      local_c0.field_1.textValue.super_StringPtr.content.size_ = 0;
      (*(code *)(local_c0.field_1.anyPointerValue.reader.segment)->arena->_vptr_Arena)
                (local_c0.field_1.intValue,
                 (long)&((SegmentReader *)uVar1)->arena +
                 (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena);
    }
  }
  else {
    switch(WVar3) {
    case TEXT:
      if (orphan->type != TEXT) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x529,FAILED,"orphan.getType() == DynamicValue::TEXT","\"Value type mismatch.\""
                   ,(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c0);
      }
      break;
    case DATA:
      if (orphan->type != DATA) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x52e,FAILED,"orphan.getType() == DynamicValue::DATA","\"Value type mismatch.\""
                   ,(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c0);
      }
      break;
    case LIST:
      local_78._0_16_ = Type::asList((Type *)this);
      if ((orphan->type != LIST) ||
         (bVar2 = Type::operator==((Type *)&(orphan->field_1).enumValue,(Type *)&local_78), !bVar2))
      {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x535,FAILED,
                   "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
                   "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c0);
      }
      break;
    case ENUM:
      goto switchD_001756a1_caseD_f;
    case STRUCT:
      SVar5 = Type::asStruct((Type *)this);
      if ((orphan->type == STRUCT) &&
         ((RawBrandedSchema *)(orphan->field_1).intValue == SVar5.super_Schema.raw)) {
        _::ListBuilder::getStructElement(&local_78,&this->builder,index);
        local_50 = SVar5.super_Schema.raw;
        Schema::getProto((Reader *)&local_c0,&local_50);
        uVar6 = 0;
        uVar4 = 0;
        if (0x7f < local_c0.field_1._24_4_) {
          uVar4 = (uint)*(ushort *)(local_c0.field_1.textValue.super_StringPtr.content.size_ + 0xe);
        }
        if (0xcf < local_c0.field_1._24_4_) {
          uVar6 = (uint)(ushort)((local_c0.field_1.structValue.reader.segment)->ptr).size_ << 0x10;
        }
        _::OrphanBuilder::asStruct(&local_48,&orphan->builder,(StructSize)(uVar6 | uVar4));
        other.capTable = local_48.capTable;
        other.segment = local_48.segment;
        other.data = local_48.data;
        other.pointers = local_48.pointers;
        other.dataSize = local_48.dataSize;
        other.pointerCount = local_48.pointerCount;
        other._38_2_ = local_48._38_2_;
        _::StructBuilder::transferContentFrom(&local_78,other);
        return;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                ((Fault *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x53d,FAILED,
                 "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
                 "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&local_c0);
    case INTERFACE:
      other_00 = Type::asInterface((Type *)this);
      if ((orphan->type != CAPABILITY) ||
         (bVar2 = InterfaceSchema::extends(&(orphan->field_1).interfaceSchema,other_00), !bVar2)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x54a,FAILED,
                   "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
                   ,"\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c0);
      }
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x544,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal((Fault *)&local_c0);
    default:
      kj::_::unreachable();
    }
    local_c0._0_8_ = (this->builder).segment;
    local_c0.field_1.intValue = (int64_t)(this->builder).capTable;
    local_c0.field_1.structValue.reader.segment =
         (SegmentReader *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _::PointerBuilder::adopt((PointerBuilder *)&local_c0,&orphan->builder);
  }
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}